

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiTextEditCallbackData::InsertChars
          (ImGuiTextEditCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  size_t sVar1;
  int local_3c;
  int new_text_len;
  char *new_text_end_local;
  char *new_text_local;
  int pos_local;
  ImGuiTextEditCallbackData *this_local;
  
  if (new_text_end == (char *)0x0) {
    sVar1 = strlen(new_text);
    local_3c = (int)sVar1;
  }
  else {
    local_3c = (int)new_text_end - (int)new_text;
  }
  if (local_3c + this->BufTextLen + 1 < this->BufSize) {
    if (this->BufTextLen != pos) {
      memmove(this->Buf + (long)local_3c + (long)pos,this->Buf + pos,(long)(this->BufTextLen - pos))
      ;
    }
    memcpy(this->Buf + pos,new_text,(long)local_3c);
    this->Buf[this->BufTextLen + local_3c] = '\0';
    if (pos <= this->CursorPos) {
      this->CursorPos = local_3c + this->CursorPos;
    }
    this->SelectionEnd = this->CursorPos;
    this->SelectionStart = this->CursorPos;
    this->BufDirty = true;
    this->BufTextLen = local_3c + this->BufTextLen;
  }
  return;
}

Assistant:

void ImGuiTextEditCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen + 1 >= BufSize)
        return;

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}